

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDwaCompressor.cpp
# Opt level: O0

void __thiscall Imf_2_5::DwaCompressor::initializeBuffers(DwaCompressor *this,size_t *outBufferSize)

{
  CompressorScheme CVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  size_type sVar7;
  reference pvVar8;
  int *piVar9;
  NoImplExc *pNVar10;
  void *pvVar11;
  size_t sVar12;
  long *in_RSI;
  long *in_RDI;
  undefined4 extraout_XMM0_Db;
  double dVar13;
  double dVar14;
  undefined4 extraout_XMM0_Db_00;
  int i_1;
  uint chan_1;
  int i;
  int planarUncBufferSize [3];
  int rleAmount;
  uint chan;
  int maxLossyDctDcSize;
  int maxLossyDctAcSize;
  int rleBufferSize;
  int unknownBufferSize;
  int numLossyDctChans;
  int maxOutBufferSize;
  vector<Imf_2_5::DwaCompressor::CscChannelSet,_std::allocator<Imf_2_5::DwaCompressor::CscChannelSet>_>
  *in_stack_00000188;
  vector<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
  *in_stack_00000190;
  ChannelList *in_stack_00000198;
  DwaCompressor *in_stack_000001a0;
  ChannelList *in_stack_fffffffffffffed8;
  Zip *in_stack_fffffffffffffee0;
  int local_8c;
  uint local_88;
  int local_84;
  int local_80 [4];
  int local_70;
  int local_6c;
  uint local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  long *local_10;
  
  local_10 = in_RSI;
  ChannelList::ChannelList((ChannelList *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  classifyChannels(in_stack_000001a0,in_stack_00000198,in_stack_00000190,in_stack_00000188);
  ChannelList::~ChannelList((ChannelList *)0x8842c2);
  local_50 = 0;
  local_54 = 0;
  local_58 = 0;
  local_5c = 0;
  iVar3 = (**(code **)(*in_RDI + 0x10))();
  dVar13 = std::ceil((double)CONCAT44(extraout_XMM0_Db,(float)iVar3 / 8.0));
  dVar14 = std::ceil((double)CONCAT44((int)((ulong)dVar13 >> 0x20),
                                      (float)((*(int *)((long)in_RDI + 0x24) -
                                              *(int *)((long)in_RDI + 0x1c)) + 1) / 8.0));
  local_60 = (int)SUB84(dVar13,0) * (int)SUB84(dVar14,0) * 0x7e;
  iVar3 = (**(code **)(*in_RDI + 0x10))();
  dVar13 = std::ceil((double)CONCAT44(extraout_XMM0_Db_00,(float)iVar3 / 8.0));
  dVar14 = std::ceil((double)CONCAT44((int)((ulong)dVar13 >> 0x20),
                                      (float)((*(int *)((long)in_RDI + 0x24) -
                                              *(int *)((long)in_RDI + 0x1c)) + 1) / 8.0));
  local_64 = (int)SUB84(dVar13,0) * (int)SUB84(dVar14,0) * 2;
  local_68 = 0;
  do {
    uVar6 = (ulong)local_68;
    sVar7 = std::
            vector<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
            ::size((vector<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                    *)(in_RDI + 0xc));
    if (sVar7 <= uVar6) {
      iVar3 = compressBound((long)local_5c);
      local_50 = iVar3 + local_50;
      iVar3 = compressBound((long)local_58);
      local_50 = iVar3 + local_50;
      if (in_RDI[0x23] == 0) {
        pvVar11 = operator_new(0x10);
        Zip::Zip(in_stack_fffffffffffffee0,(size_t)in_stack_fffffffffffffed8);
        in_RDI[0x23] = (long)pvVar11;
      }
      else {
        sVar12 = Zip::maxRawSize((Zip *)in_RDI[0x23]);
        if (sVar12 < (ulong)(long)(local_64 * local_54)) {
          pvVar11 = (void *)in_RDI[0x23];
          if (pvVar11 != (void *)0x0) {
            Zip::~Zip(in_stack_fffffffffffffee0);
            operator_delete(pvVar11,0x10);
          }
          pvVar11 = operator_new(0x10);
          Zip::Zip(in_stack_fffffffffffffee0,(size_t)in_stack_fffffffffffffed8);
          in_RDI[0x23] = (long)pvVar11;
        }
      }
      sVar12 = Zip::maxCompressedSize(in_stack_fffffffffffffee0);
      local_50 = local_50 + (int)sVar12 + 0x58;
      *local_10 = (long)local_50;
      if ((ulong)in_RDI[0x16] < (ulong)(long)(local_60 * local_54)) {
        in_RDI[0x16] = (long)(local_60 * local_54);
        if ((in_RDI[0x15] != 0) && ((void *)in_RDI[0x15] != (void *)0x0)) {
          operator_delete__((void *)in_RDI[0x15]);
        }
        pvVar11 = operator_new__(in_RDI[0x16]);
        in_RDI[0x15] = (long)pvVar11;
      }
      if ((ulong)in_RDI[0x18] < (ulong)(long)(local_64 * local_54)) {
        in_RDI[0x18] = (long)(local_64 * local_54);
        if ((in_RDI[0x17] != 0) && ((void *)in_RDI[0x17] != (void *)0x0)) {
          operator_delete__((void *)in_RDI[0x17]);
        }
        pvVar11 = operator_new__(in_RDI[0x18]);
        in_RDI[0x17] = (long)pvVar11;
      }
      if ((ulong)in_RDI[0x1a] < (ulong)(long)local_5c) {
        in_RDI[0x1a] = (long)local_5c;
        if ((in_RDI[0x19] != 0) && ((void *)in_RDI[0x19] != (void *)0x0)) {
          operator_delete__((void *)in_RDI[0x19]);
        }
        pvVar11 = operator_new__((long)local_5c);
        in_RDI[0x19] = (long)pvVar11;
      }
      for (local_84 = 0; local_84 < 3; local_84 = local_84 + 1) {
        local_80[local_84] = 0;
      }
      local_88 = 0;
      do {
        sVar7 = std::
                vector<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                ::size((vector<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                        *)(in_RDI + 0xc));
        if (sVar7 <= local_88) {
          if (0 < local_80[0]) {
            local_80[0] = compressBound((long)local_80[0]);
          }
          for (local_8c = 0; local_8c < 3; local_8c = local_8c + 1) {
            if ((ulong)in_RDI[(long)local_8c + 0x20] < (ulong)(long)local_80[local_8c]) {
              in_RDI[(long)local_8c + 0x20] = (long)local_80[local_8c];
              if ((in_RDI[(long)local_8c + 0x1d] != 0) &&
                 ((void *)in_RDI[(long)local_8c + 0x1d] != (void *)0x0)) {
                operator_delete__((void *)in_RDI[(long)local_8c + 0x1d]);
              }
              pvVar11 = operator_new__((long)local_80[local_8c]);
              in_RDI[(long)local_8c + 0x1d] = (long)pvVar11;
            }
          }
          return;
        }
        pvVar8 = std::
                 vector<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                 ::operator[]((vector<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                               *)(in_RDI + 0xc),(ulong)local_88);
        CVar1 = pvVar8->compression;
        if (CVar1 == UNKNOWN) {
          iVar4 = (**(code **)(*in_RDI + 0x10))();
          iVar3 = *(int *)((long)in_RDI + 0x24);
          iVar2 = *(int *)((long)in_RDI + 0x1c);
          std::
          vector<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
          ::operator[]((vector<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                        *)(in_RDI + 0xc),(ulong)local_88);
          iVar5 = pixelTypeSize((PixelType)((ulong)in_stack_fffffffffffffee0 >> 0x20));
          local_80[0] = iVar4 * ((iVar3 - iVar2) + 1) * iVar5 + local_80[0];
        }
        else if (CVar1 != LOSSY_DCT) {
          if (CVar1 != RLE) {
            pNVar10 = (NoImplExc *)__cxa_allocate_exception(0x48);
            Iex_2_5::NoImplExc::NoImplExc(pNVar10,"Unhandled compression scheme case");
            __cxa_throw(pNVar10,&Iex_2_5::NoImplExc::typeinfo,Iex_2_5::NoImplExc::~NoImplExc);
          }
          iVar4 = (**(code **)(*in_RDI + 0x10))();
          iVar3 = *(int *)((long)in_RDI + 0x24);
          iVar2 = *(int *)((long)in_RDI + 0x1c);
          std::
          vector<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
          ::operator[]((vector<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                        *)(in_RDI + 0xc),(ulong)local_88);
          iVar5 = pixelTypeSize((PixelType)((ulong)in_stack_fffffffffffffee0 >> 0x20));
          local_80[2] = iVar4 * ((iVar3 - iVar2) + 1) * iVar5 + local_80[2];
        }
        local_88 = local_88 + 1;
      } while( true );
    }
    pvVar8 = std::
             vector<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
             ::operator[]((vector<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                           *)(in_RDI + 0xc),(ulong)local_68);
    CVar1 = pvVar8->compression;
    if (CVar1 == UNKNOWN) {
      iVar4 = (**(code **)(*in_RDI + 0x10))();
      iVar3 = *(int *)((long)in_RDI + 0x24);
      iVar2 = *(int *)((long)in_RDI + 0x1c);
      std::
      vector<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
      ::operator[]((vector<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                    *)(in_RDI + 0xc),(ulong)local_68);
      iVar5 = pixelTypeSize((PixelType)((ulong)in_stack_fffffffffffffee0 >> 0x20));
      local_58 = iVar4 * ((iVar3 - iVar2) + 1) * iVar5 + local_58;
    }
    else if (CVar1 == LOSSY_DCT) {
      local_6c = local_60 * 2 + 0x10000;
      local_70 = compressBound((long)local_60);
      piVar9 = std::max<int>(&local_6c,&local_70);
      local_50 = *piVar9 + local_50;
      local_54 = local_54 + 1;
    }
    else {
      if (CVar1 != RLE) {
        pNVar10 = (NoImplExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::NoImplExc::NoImplExc(pNVar10,"Unhandled compression scheme case");
        __cxa_throw(pNVar10,&Iex_2_5::NoImplExc::typeinfo,Iex_2_5::NoImplExc::~NoImplExc);
      }
      iVar4 = (**(code **)(*in_RDI + 0x10))();
      iVar3 = *(int *)((long)in_RDI + 0x24);
      iVar2 = *(int *)((long)in_RDI + 0x1c);
      std::
      vector<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
      ::operator[]((vector<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                    *)(in_RDI + 0xc),(ulong)local_68);
      local_80[3] = pixelTypeSize((PixelType)((ulong)in_stack_fffffffffffffee0 >> 0x20));
      local_80[3] = iVar4 * 2 * ((iVar3 - iVar2) + 1) * local_80[3];
      local_5c = local_80[3] + local_5c;
    }
    local_68 = local_68 + 1;
  } while( true );
}

Assistant:

void
DwaCompressor::initializeBuffers (size_t &outBufferSize)
{
    classifyChannels (_channels, _channelData, _cscSets);

    //
    // _outBuffer needs to be big enough to hold all our 
    // compressed data - which could vary depending on what sort
    // of channels we have. 
    //

    int maxOutBufferSize  = 0;
    int numLossyDctChans  = 0;
    int unknownBufferSize = 0;
    int rleBufferSize     = 0;

    int maxLossyDctAcSize = (int)ceil ((float)numScanLines() / 8.0f) * 
                            (int)ceil ((float)(_max[0] - _min[0] + 1) / 8.0f) *
                            63 * sizeof (unsigned short);

    int maxLossyDctDcSize = (int)ceil ((float)numScanLines() / 8.0f) * 
                            (int)ceil ((float)(_max[0] - _min[0] + 1) / 8.0f) *
                            sizeof (unsigned short);

    for (unsigned int chan = 0; chan < _channelData.size(); ++chan)
    {
        switch (_channelData[chan].compression)
        {
          case LOSSY_DCT:

            //
            // This is the size of the number of packed
            // components, plus the requirements for
            // maximum Huffman encoding size (for STATIC_HUFFMAN)
            // or for zlib compression (for DEFLATE)
            //

            maxOutBufferSize += std::max(
                            (int)(2 * maxLossyDctAcSize + 65536),
                            (int)compressBound (maxLossyDctAcSize) );
            numLossyDctChans++;
            break;

          case RLE:
            {
                //
                // RLE, if gone horribly wrong, could double the size
                // of the source data.
                //

                int rleAmount = 2 * numScanLines() * (_max[0] - _min[0] + 1) *
                                OPENEXR_IMF_NAMESPACE::pixelTypeSize (_channelData[chan].type);

                rleBufferSize += rleAmount;
            }
            break;


          case UNKNOWN:

            unknownBufferSize += numScanLines() * (_max[0] - _min[0] + 1) *
                                 OPENEXR_IMF_NAMESPACE::pixelTypeSize (_channelData[chan].type);
            break;

          default:

            throw IEX_NAMESPACE::NoImplExc ("Unhandled compression scheme case");
            break;
        }
    }

    //
    // Also, since the results of the RLE are packed into 
    // the output buffer, we need the extra room there. But
    // we're going to zlib compress() the data we pack, 
    // which could take slightly more space
    //

    maxOutBufferSize += (int)compressBound ((uLongf)rleBufferSize);
    
    //
    // And the same goes for the UNKNOWN data
    //

    maxOutBufferSize += (int)compressBound ((uLongf)unknownBufferSize);

    //
    // Allocate a zip/deflate compressor big enought to hold the DC data
    // and include it's compressed results in the size requirements
    // for our output buffer
    //

    if (_zip == 0) 
        _zip = new Zip (maxLossyDctDcSize * numLossyDctChans);
    else if (_zip->maxRawSize() < static_cast<size_t>(maxLossyDctDcSize * numLossyDctChans))
    {
        delete _zip;
        _zip = new Zip (maxLossyDctDcSize * numLossyDctChans);
    }


    maxOutBufferSize += _zip->maxCompressedSize();

    //
    // We also need to reserve space at the head of the buffer to 
    // write out the size of our various packed and compressed data.
    //

    maxOutBufferSize += NUM_SIZES_SINGLE * sizeof (Int64); 
                    

    //
    // Later, we're going to hijack outBuffer for the result of
    // both encoding and decoding. So it needs to be big enough
    // to hold either a buffers' worth of uncompressed or
    // compressed data
    //
    // For encoding, we'll need _outBuffer to hold maxOutBufferSize bytes,
    // but for decoding, we only need it to be maxScanLineSize*numScanLines.
    // Cache the max size for now, and alloc the buffer when we either
    // encode or decode.
    //

    outBufferSize = maxOutBufferSize;


    //
    // _packedAcBuffer holds the quantized DCT coefficients prior
    // to Huffman encoding
    //

    if (static_cast<size_t>(maxLossyDctAcSize * numLossyDctChans) > _packedAcBufferSize)
    {
        _packedAcBufferSize = maxLossyDctAcSize * numLossyDctChans;
        if (_packedAcBuffer != 0) 
            delete[] _packedAcBuffer;
        _packedAcBuffer = new char[_packedAcBufferSize];
    }

    //
    // _packedDcBuffer holds one quantized DCT coef per 8x8 block
    //

    if (static_cast<size_t>(maxLossyDctDcSize * numLossyDctChans) > _packedDcBufferSize)
    {
        _packedDcBufferSize = maxLossyDctDcSize * numLossyDctChans;
        if (_packedDcBuffer != 0) 
            delete[] _packedDcBuffer;
        _packedDcBuffer     = new char[_packedDcBufferSize];
    }

    if (static_cast<size_t>(rleBufferSize) > _rleBufferSize) 
    {
        _rleBufferSize = rleBufferSize;
        if (_rleBuffer != 0) 
            delete[] _rleBuffer;
        _rleBuffer = new char[rleBufferSize];
    }

    // 
    // The planar uncompressed buffer will hold float data for LOSSY_DCT
    // compressed values, and whatever the native type is for other
    // channels. We're going to use this to hold data in a planar
    // format, as opposed to the native interleaved format we take
    // into compress() and give back from uncompress().
    //
    // This also makes it easier to compress the UNKNOWN and RLE data
    // all in one swoop (for each compression scheme).
    //

    int planarUncBufferSize[NUM_COMPRESSOR_SCHEMES];
    for (int i=0; i<NUM_COMPRESSOR_SCHEMES; ++i)
        planarUncBufferSize[i] = 0;

    for (unsigned int chan = 0; chan < _channelData.size(); ++chan)
    {
        switch (_channelData[chan].compression)
        {
          case LOSSY_DCT:
            break;

          case RLE:
            planarUncBufferSize[RLE] +=
                     numScanLines() * (_max[0] - _min[0] + 1) *
                     OPENEXR_IMF_NAMESPACE::pixelTypeSize (_channelData[chan].type);
            break;

          case UNKNOWN: 
            planarUncBufferSize[UNKNOWN] +=
                     numScanLines() * (_max[0] - _min[0] + 1) *
                     OPENEXR_IMF_NAMESPACE::pixelTypeSize (_channelData[chan].type);
            break;

          default:
            throw IEX_NAMESPACE::NoImplExc ("Unhandled compression scheme case");
            break;
        }
    }

    //
    // UNKNOWN data is going to be zlib compressed, which needs 
    // a little extra headroom
    //

    if (planarUncBufferSize[UNKNOWN] > 0)
    {
        planarUncBufferSize[UNKNOWN] = 
            compressBound ((uLongf)planarUncBufferSize[UNKNOWN]);
    }

    for (int i = 0; i < NUM_COMPRESSOR_SCHEMES; ++i)
    {
        if (static_cast<size_t>(planarUncBufferSize[i]) > _planarUncBufferSize[i]) 
        {
            _planarUncBufferSize[i] = planarUncBufferSize[i];
            if (_planarUncBuffer[i] != 0) 
                delete[] _planarUncBuffer[i];
            _planarUncBuffer[i] = new char[planarUncBufferSize[i]];
        }
    }
}